

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2text.cpp
# Opt level: O2

void setTempo(MidiFile *midifile,int index,double *tempo)

{
  pointer puVar1;
  MidiEventList *this;
  MidiEvent *pMVar2;
  ostream *poVar3;
  double dVar4;
  
  setTempo::count = setTempo::count + 1;
  this = smf::MidiFile::operator[](midifile,0);
  pMVar2 = smf::MidiEventList::operator[](this,index);
  puVar1 = (pMVar2->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar4 = (60.0 / (double)((uint)puVar1[5] | (uint)puVar1[4] << 8 | (uint)puVar1[3] << 0x10)) *
          1000000.0;
  if (setTempo::count < 2) {
    *tempo = dVar4;
  }
  else if ((*tempo != dVar4) || (NAN(*tempo) || NAN(dVar4))) {
    std::operator<<((ostream *)&std::cout,"; WARNING: change of tempo from ");
    poVar3 = std::ostream::_M_insert<double>(*tempo);
    std::operator<<(poVar3," to ");
    poVar3 = std::ostream::_M_insert<double>(dVar4);
    poVar3 = std::operator<<(poVar3," ignored");
    std::endl<char,std::char_traits<char>>(poVar3);
    return;
  }
  return;
}

Assistant:

void setTempo(MidiFile& midifile, int index, double& tempo) {
   static int count = 0;
   count++;

   MidiEvent& mididata = midifile[0][index];

   int microseconds = 0;
   microseconds = microseconds | (mididata[3] << 16);
   microseconds = microseconds | (mididata[4] << 8);
   microseconds = microseconds | (mididata[5] << 0);

   double newtempo = 60.0 / microseconds * 1000000.0;
   if (count <= 1) {
      tempo = newtempo;
   } else if (tempo != newtempo) {
      cout << "; WARNING: change of tempo from " << tempo
           << " to " << newtempo << " ignored" << endl;
   }
}